

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::SSLSocketStream::read(SSLSocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  int num;
  undefined4 in_register_00000034;
  void *buf;
  int local_30;
  int local_2c;
  int err;
  int ret;
  size_t size_local;
  char *ptr_local;
  SSLSocketStream *this_local;
  
  buf = (void *)CONCAT44(in_register_00000034,__fd);
  iVar1 = SSL_pending((SSL *)this->ssl_);
  num = (int)__buf;
  if (iVar1 < 1) {
    uVar2 = (*(this->super_Stream)._vptr_Stream[2])();
    if ((uVar2 & 1) == 0) {
      this_local = (SSLSocketStream *)0xffffffffffffffff;
    }
    else {
      local_2c = SSL_read((SSL *)this->ssl_,buf,num);
      if (local_2c < 0) {
        local_30 = SSL_get_error((SSL *)this->ssl_,local_2c);
        while (local_30 == 2) {
          iVar1 = SSL_pending((SSL *)this->ssl_);
          if (0 < iVar1) {
            iVar1 = SSL_read((SSL *)this->ssl_,buf,num);
            return (long)iVar1;
          }
          uVar2 = (*(this->super_Stream)._vptr_Stream[2])();
          if ((uVar2 & 1) == 0) {
            return -1;
          }
          local_2c = SSL_read((SSL *)this->ssl_,buf,num);
          if (-1 < local_2c) {
            return (long)local_2c;
          }
          local_30 = SSL_get_error((SSL *)this->ssl_,local_2c);
        }
      }
      this_local = (SSLSocketStream *)(long)local_2c;
    }
  }
  else {
    iVar1 = SSL_read((SSL *)this->ssl_,buf,num);
    this_local = (SSLSocketStream *)(long)iVar1;
  }
  return (ssize_t)this_local;
}

Assistant:

inline ssize_t SSLSocketStream::read(char *ptr, size_t size) {
  if (SSL_pending(ssl_) > 0) {
    return SSL_read(ssl_, ptr, static_cast<int>(size));
  } else if (is_readable()) {
    auto ret = SSL_read(ssl_, ptr, static_cast<int>(size));
    if (ret < 0) {
      auto err = SSL_get_error(ssl_, ret);
      while (err == SSL_ERROR_WANT_READ) {
        if (SSL_pending(ssl_) > 0) {
          return SSL_read(ssl_, ptr, static_cast<int>(size));
        } else if (is_readable()) {
          ret = SSL_read(ssl_, ptr, static_cast<int>(size));
          if (ret >= 0) { return ret; }
          err = SSL_get_error(ssl_, ret);
        } else {
          return -1;
        }
      }
    }
    return ret;
  }
  return -1;
}